

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.h
# Opt level: O2

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::AddChild(Node *this,Node *child)

{
  Node *local_10;
  Node *child_local;
  
  local_10 = child;
  std::
  vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
  ::push_back(&this->children_,&local_10);
  return;
}

Assistant:

void AddChild(Node* child) { children_.push_back(child); }